

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::TableStruct::
     InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/VisionFeaturePrint.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                    *)_VisionFeaturePrint_Scene_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                    *)_VisionFeaturePrint_Objects_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint> *)
             _VisionFeaturePrint_default_instance_);
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _VisionFeaturePrint_Scene_default_instance_.DefaultConstruct();
  _VisionFeaturePrint_Objects_default_instance_.DefaultConstruct();
  _VisionFeaturePrint_default_instance_.DefaultConstruct();
}